

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O1

int linb::any::vtable_dynamic<ModelAnnotation>::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  long lVar2;
  undefined8 *puVar3;
  
  puVar3 = (undefined8 *)operator_new(0x18);
  puVar1 = *(undefined8 **)dst;
  *puVar3 = *puVar1;
  lVar2 = puVar1[1];
  puVar3[1] = lVar2;
  if (lVar2 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar2 + 0xc) = *(int *)(lVar2 + 0xc) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar2 + 0xc) = *(int *)(lVar2 + 0xc) + 1;
    }
  }
  *(undefined4 *)(puVar3 + 2) = *(undefined4 *)(puVar1 + 2);
  *(undefined8 **)src = puVar3;
  return (int)puVar3;
}

Assistant:

static void copy(const storage_union& src, storage_union& dest)
        {
            dest.dynamic = new T(*reinterpret_cast<const T*>(src.dynamic));
        }